

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O2

size_t IpmiFruWriteMultirecords(FILE *ofd,Exp_EEP_t *exp_eep,uint dynamic_offset,size_t size)

{
  uint8_t *puVar1;
  uint16_t instance_id;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  size_t sStack_60;
  uint8_t block_id;
  int local_54;
  size_t local_50;
  uint local_48;
  int piece_offset;
  FILE *local_40;
  size_t local_38;
  
  local_40 = ofd;
  if (*(int *)exp_eep->GenId == 0x306d6f43) {
    if (verbose == '\x01') {
      puts("Encoding COM-Express Carrier description");
    }
    sStack_60 = 0x31;
LAB_001015fe:
    IpmiFruEncodeCarrier(exp_eep,sStack_60);
  }
  else {
    puVar1 = exp_eep->GenId;
    if (*(int *)puVar1 == 0x486d6f43) {
      if (verbose == '\x01') {
        puts("Encoding COM-HPC Carrier description");
      }
      sStack_60 = 0x4f;
      goto LAB_001015fe;
    }
    if (*(int *)puVar1 == 0x304d6f63) {
      if (verbose == '\x01') {
        puts("Encoding COM-Express Module description");
      }
      sStack_60 = 0x12;
    }
    else {
      bVar2 = false;
      if (*(int *)puVar1 != 0x484d6f63) goto LAB_0010162d;
      if (verbose == '\x01') {
        puts("Encoding COM-HPC Module description");
      }
      sStack_60 = 0x1e;
    }
    IpmiFruEncodeModule(exp_eep,sStack_60);
  }
  bVar2 = true;
LAB_0010162d:
  local_50 = 0;
  local_54 = 0;
  local_38 = size;
  do {
    if (size <= dynamic_offset) {
      if (bVar2) {
        sVar4 = IpmiFruWritePreparedMultirecord(local_40,1);
        if ((int)(uint)sVar4 < 1) {
LAB_00101771:
          local_50 = 0xffffffffffffffff;
        }
        else {
          local_50 = local_50 + ((uint)sVar4 & 0x7fffffff);
        }
      }
      return local_50;
    }
    sVar4 = ParseDynamic(exp_eep,dynamic_offset,size,&block_id);
    uVar6 = (uint)sVar4;
    if ((int)uVar6 < 1) {
      fprintf(_stderr,"Failed to parse a dynamic record at offset %d\n",(ulong)dynamic_offset);
      goto LAB_00101771;
    }
    if ((block_id != '\0') && (block_id != 0xf2)) {
      piece_offset = 0;
      bVar2 = !bVar2;
      instance_id = (uint16_t)local_54;
      local_48 = (uint)block_id;
      do {
        if (!bVar2) {
          sVar5 = IpmiFruWritePreparedMultirecord(local_40,0);
          if ((int)(uint)sVar5 < 1) goto LAB_00101771;
          local_50 = local_50 + ((uint)sVar5 & 0x7fffffff);
        }
        uVar3 = IpmiFruEncodeDynamic
                          (exp_eep,dynamic_offset,(ulong)(uVar6 & 0x7fffffff),instance_id,
                           &piece_offset);
        if (verbose == '\x01') {
          printf("Encoding dynamic block %x, size=%d, offset=%d, instance=%d, last piece=%d\n",
                 (ulong)local_48,sVar4 & 0xffffffff,(ulong)dynamic_offset,(ulong)instance_id,
                 (ulong)uVar3);
        }
        bVar2 = false;
      } while (uVar3 == 0);
      local_54 = local_54 + 1;
      bVar2 = true;
      size = local_38;
    }
    dynamic_offset = dynamic_offset + uVar6;
  } while( true );
}

Assistant:

size_t IpmiFruWriteMultirecords(FILE *ofd, Exp_EEP_t *exp_eep, unsigned int dynamic_offset, size_t size)
{
    size_t acc_size = 0;
    int res;
    BOOL multirecord_present = FALSE;
    
    if (memcmp(exp_eep->GenId, "Com0", 4) == 0) {
        //  Encode Com0 carrier record
        if (verbose) printf("Encoding COM-Express Carrier description\n");
        IpmiFruEncodeCarrier(exp_eep, sizeof(COM0R20_CB_t));
        multirecord_present = TRUE;
    } else if (memcmp(exp_eep->GenId, "ComH", 4) == 0) {
        //  Encode ComH carrier record
        if (verbose) printf("Encoding COM-HPC Carrier description\n");
        IpmiFruEncodeCarrier(exp_eep, sizeof(COMHR10_CB_t));
        multirecord_present = TRUE;
    } else if (memcmp(exp_eep->GenId, "coM0", 4) == 0) {
        //  Encode Com0 module record
        if (verbose) printf("Encoding COM-Express Module description\n");
        IpmiFruEncodeModule(exp_eep, sizeof(COM0R20_M_t));
        multirecord_present = TRUE;
    } else if (memcmp(exp_eep->GenId, "coMH", 4) == 0) {
        //  Encode ComH module record
        if (verbose) printf("Encoding COM-HPC Module description\n");
        IpmiFruEncodeModule(exp_eep, sizeof(COMHR10_M_t));
        multirecord_present = TRUE;
    }
    //  Now encode dynamic records
    uint16_t instance_id = 0;
    while (dynamic_offset < size) {
        uint8_t block_id;
        int next_size = ParseDynamic(exp_eep, dynamic_offset, size, &block_id);
        if (next_size <= 0) {
            fprintf(stderr, "Failed to parse a dynamic record at offset %d\n", dynamic_offset);
            return -1;
        }
        if(block_id != EEEP_BLOCK_ID_UNUSED && block_id != EEEP_BLOCK_ID_CRC_CHK) {
            int piece_offset = 0;
            BOOL last_piece;
            do {
                if (multirecord_present) {
                    if ((res = IpmiFruWritePreparedMultirecord(ofd, FALSE)) <= 0) {                
                        return -1;
                    }
                    acc_size += res;
                }
                last_piece = IpmiFruEncodeDynamic(exp_eep, dynamic_offset, next_size, 
                    instance_id, &piece_offset); 
                if (verbose) printf("Encoding dynamic block %x, size=%d, offset=%d, instance=%d, last piece=%d\n", 
                        block_id, next_size, dynamic_offset, instance_id, last_piece);
                multirecord_present = TRUE;
            } while (!last_piece);
            instance_id ++;
        }
        dynamic_offset += next_size;
    }
    //  Write last record 
    if (multirecord_present) {
        if ((res = IpmiFruWritePreparedMultirecord(ofd, TRUE)) <= 0) {                
            return -1;
        }
        acc_size += res;
    }
    return acc_size;
}